

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O3

gdImagePtr gdImageCreateFromWBMPPtr(int size,void *data)

{
  gdIOCtx *infile;
  gdImagePtr pgVar1;
  
  infile = gdNewDynamicCtxEx(size,data,0);
  if (infile == (gdIOCtx *)0x0) {
    pgVar1 = (gdImagePtr)0x0;
  }
  else {
    pgVar1 = gdImageCreateFromWBMPCtx(infile);
    (*infile->gd_free)(infile);
  }
  return pgVar1;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromWBMPPtr(int size, void *data)
{
	gdImagePtr im;
	gdIOCtx *in = gdNewDynamicCtxEx(size, data, 0);
	if(!in) {
		return 0;
	}
	im = gdImageCreateFromWBMPCtx(in);
	in->gd_free(in);
	return im;
}